

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::GetNumberToken(Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  byte *pbVar1;
  byte *pbVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  ReservedChars RVar6;
  long lVar7;
  
  bVar5 = ReadNum(this);
  if (!bVar5) goto LAB_00155317;
  pbVar1 = (byte *)this->buffer_end_;
  pbVar2 = (byte *)this->cursor_;
  if (pbVar2 < pbVar1) {
    bVar5 = *pbVar2 == 0x2e;
  }
  else {
    bVar5 = false;
  }
  if (bVar5 && pbVar2 < pbVar1) {
    this->cursor_ = (char *)(pbVar2 + 1);
  }
  if (bVar5) {
    if (this->cursor_ < pbVar1) {
      lVar7 = (ulong)(byte)*this->cursor_ + 1;
    }
    else {
      lVar7 = 0;
    }
    token_type = First_Literal;
    if (((""[lVar7] & 8U) != 0) && (bVar5 = ReadNum(this), !bVar5)) goto LAB_00155317;
  }
  pcVar3 = this->buffer_end_;
  pcVar4 = this->cursor_;
  if (pcVar4 < pcVar3) {
    bVar5 = *pcVar4 == 'e';
  }
  else {
    bVar5 = false;
  }
  if (bVar5 && pcVar4 < pcVar3) {
    this->cursor_ = pcVar4 + 1;
  }
  if (bVar5) {
LAB_001552d1:
    pcVar4 = this->cursor_;
    bVar5 = true;
    if (pcVar4 < pcVar3) {
      if (*pcVar4 != '+') {
        bVar5 = *pcVar4 != '-';
        goto LAB_001552e9;
      }
LAB_001552f3:
      this->cursor_ = pcVar4 + 1;
    }
    else {
LAB_001552e9:
      if (!(bool)(pcVar3 <= pcVar4 | bVar5)) goto LAB_001552f3;
    }
    bVar5 = ReadNum(this);
    token_type = First_Literal;
    if (!bVar5) goto LAB_00155317;
  }
  else {
    pcVar4 = this->cursor_;
    if (pcVar4 < pcVar3) {
      bVar5 = *pcVar4 == 'E';
    }
    else {
      bVar5 = false;
    }
    if (bVar5 && pcVar4 < pcVar3) {
      this->cursor_ = pcVar4 + 1;
    }
    if (bVar5) goto LAB_001552d1;
  }
  RVar6 = ReadReservedChars(this);
  if (RVar6 == None) {
    bVar5 = token_type == First_Literal;
    if (bVar5) {
      token_type = First_Literal;
    }
    LiteralToken(__return_storage_ptr__,this,token_type,(uint)bVar5);
    return __return_storage_ptr__;
  }
LAB_00155317:
  ReadReservedChars(this);
  TextToken(__return_storage_ptr__,this,Reserved,0);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNumberToken(TokenType token_type) {
  if (ReadNum()) {
    if (MatchChar('.')) {
      token_type = TokenType::Float;
      if (IsDigit(PeekChar()) && !ReadNum()) {
        return GetReservedToken();
      }
    }
    if (MatchChar('e') || MatchChar('E')) {
      token_type = TokenType::Float;
      ReadSign();
      if (!ReadNum()) {
        return GetReservedToken();
      }
    }
    if (NoTrailingReservedChars()) {
      if (token_type == TokenType::Float) {
        return LiteralToken(token_type, LiteralType::Float);
      } else {
        return LiteralToken(token_type, LiteralType::Int);
      }
    }
  }
  return GetReservedToken();
}